

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta,float objective_amplifier)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  undefined8 extraout_RAX;
  row_iterator prVar6;
  ulong uVar7;
  rc_data *__last;
  undefined8 uVar8;
  rc_data *__first;
  ulong uVar9;
  undefined1 auVar10 [64];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_84;
  uint local_80;
  int local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  bit_array *local_68;
  solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
  *local_60;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  undefined8 local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  row_iterator local_38;
  undefined1 extraout_var [60];
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_78 = objective_amplifier;
  local_74 = theta;
  local_70 = delta;
  local_6c = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_6c,&local_70,&local_74);
  piVar4 = (first->current)._M_current;
  if (piVar4 == (last->current)._M_current) {
    uVar8 = 0;
  }
  else {
    local_60 = this + 0x10;
    uVar8 = 0;
    local_68 = x;
    local_58 = first;
    local_50 = last;
    do {
      local_84 = piVar4[-1];
      if (*(int *)(this + 0x78) <= local_84) {
        push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_48 = uVar8;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_60);
      if (local_38 != (row_iterator)local_40._M_head_impl) {
        lVar5 = *(long *)(this + 0x50);
        prVar6 = local_38;
        do {
          piVar4 = &prVar6->value;
          prVar6 = prVar6 + 1;
          *(float *)(lVar5 + (long)*piVar4 * 4) = local_74 * *(float *)(lVar5 + (long)*piVar4 * 4);
        } while (prVar6 != (row_iterator)local_40._M_head_impl);
      }
      local_80 = solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                             *)this,local_38,(row_iterator)local_40._M_head_impl,x);
      uVar7 = (ulong)local_80;
      if (local_80 != 0) {
        __first = *(rc_data **)(this + 0x58);
        uVar9 = 0;
        do {
          auVar10._0_4_ =
               quadratic_cost_type<float>::operator()
                         (*(quadratic_cost_type<float> **)(this + 0x70),__first[uVar9].id,x);
          auVar10._4_60_ = extraout_var;
          __first = *(rc_data **)(this + 0x58);
          auVar1 = vfmadd213ss_fma(auVar10._0_16_,ZEXT416((uint)local_78),
                                   ZEXT416((uint)__first[uVar9].value));
          __first[uVar9].value = auVar1._0_4_;
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if (1 < (int)local_80) {
          lVar5 = (long)(int)local_80;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar5,(int)LZCOUNT(lVar5) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar5);
          __last = __first + 1;
          lVar5 = lVar5 * 8 + -8;
          do {
            if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last,__g);
              __first = __last;
            }
            __last = __last + 1;
            lVar5 = lVar5 + -8;
          } while (lVar5 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,__last,__g);
          x = local_68;
        }
      }
      uVar2 = local_80;
      local_7c = solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::select_variables((solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                                     *)this,local_80,
                                    *(int *)(*(long *)(this + 0x60) + (long)local_84 * 8),
                                    *(int *)(*(long *)(this + 0x60) + 4 + (long)local_84 * 8));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_84,
                 (int *)((long)local_84 * 8 + *(long *)(this + 0x60)));
      if (0 < (int)uVar2) {
        lVar5 = 0;
        do {
          fmt_01._M_str = "({} {}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<float,int>
                    ((debug_logger<true> *)this,fmt_01,(float *)(*(long *)(this + 0x58) + lVar5),
                     (int *)(*(long *)(this + 0x58) + 4 + lVar5));
          lVar5 = lVar5 + 8;
        } while (uVar7 << 3 != lVar5);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x60) + 4 + (long)local_84 * 8),&local_7c);
      bVar3 = affect<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)this,x,local_38,local_84,local_7c,local_80,local_6c,local_70);
      uVar8 = CONCAT71((int7)((ulong)local_48 >> 8),(byte)local_48 | bVar3);
      piVar4 = (local_58->current)._M_current + -1;
      (local_58->current)._M_current = piVar4;
    } while (piVar4 != (local_50->current)._M_current);
  }
  return (bool)((byte)uVar8 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }